

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O2

void __thiscall Jinx::Impl::FunctionSignature::Write(FunctionSignature *this,BinaryWriter *writer)

{
  pointer pFVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *name;
  pointer val;
  FunctionSignaturePart *part;
  pointer pFVar3;
  
  BinaryWriter::Write(writer,this->m_id);
  BinaryWriter::Write(writer,(char)this->m_visibility);
  BinaryWriter::Write(writer,&this->m_libraryName);
  BinaryWriter::Write(writer,(uint8_t)(((long)(this->m_parts).
                                              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->m_parts).
                                             super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0xc0));
  pFVar1 = (this->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar3 = (this->m_parts).
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar3 != pFVar1; pFVar3 = pFVar3 + 1) {
    BinaryWriter::Write(writer,(char)pFVar3->partType);
    BinaryWriter::Write(writer,pFVar3->optional);
    BinaryWriter::Write(writer,(char)pFVar3->valueType);
    BinaryWriter::Write(writer,(uint8_t)((uint)(*(int *)&(pFVar3->names).
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               *(int *)&(pFVar3->names).
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
    pbVar2 = (pFVar3->names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (val = (pFVar3->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_start; val != pbVar2; val = val + 1) {
      BinaryWriter::Write(writer,val);
    }
  }
  return;
}

Assistant:

inline_t void FunctionSignature::Write(BinaryWriter & writer) const
	{
		// Write this object to a memory buffer
		writer.Write(m_id);
		writer.Write<VisibilityType, uint8_t>(m_visibility);
		writer.Write(m_libraryName);
		writer.Write(static_cast<uint8_t>(m_parts.size()));
		for (const auto & part : m_parts)
		{
			writer.Write<FunctionSignaturePartType, uint8_t>(part.partType);
			writer.Write(part.optional);
			writer.Write<ValueType, uint8_t>(part.valueType);
			writer.Write(static_cast<uint8_t>(part.names.size()));
			for (const auto & name : part.names)
			{
				writer.Write(name);
			}
		}
	}